

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

void calc_attr_bonus(void)

{
  char cVar1;
  short sVar2;
  obj *otmp;
  undefined4 uVar3;
  boolean bVar4;
  uint uVar5;
  long lVar6;
  obj *abon_items [10];
  obj *local_78 [10];
  
  local_78[0] = uarm;
  local_78[1] = uarmu;
  local_78[2] = uarmc;
  local_78[3] = uarmh;
  local_78[4] = uarms;
  local_78[5] = uarmg;
  local_78[6] = uarmf;
  local_78[7] = uamul;
  local_78[8] = uright;
  u.abon.a[4] = '\0';
  u.abon.a[5] = '\0';
  u.abon.a[0] = '\0';
  u.abon.a[1] = '\0';
  u.abon.a[2] = '\0';
  u.abon.a[3] = '\0';
  local_78[9] = uleft;
  lVar6 = 0;
  do {
    if (lVar6 == 10) {
      return;
    }
    otmp = local_78[lVar6];
    if ((otmp != (obj *)0x0) && (bVar4 = equip_is_worn(otmp), bVar4 != '\0')) {
      cVar1 = otmp->spe;
      sVar2 = otmp->otyp;
      switch(sVar2) {
      case 0x92:
      case 0xa2:
        u.abon.a[3] = u.abon.a[3] + cVar1;
        break;
      case 0x93:
      case 0x94:
      case 0x95:
      case 0x96:
      case 0x97:
      case 0x98:
      case 0x99:
      case 0x9a:
      case 0x9b:
      case 0x9c:
        break;
      case 0x9d:
        u.abon.a[5] = u.abon.a[5] + cVar1;
        break;
      case 0x9e:
        u.abon.a[0] = u.abon.a[0] + cVar1;
        break;
      case 0x9f:
        u.abon.a[4] = u.abon.a[4] + cVar1;
        break;
      case 0xa0:
        u.abon.a[1] = u.abon.a[1] + cVar1;
        break;
      case 0xa1:
switchD_0014f489_caseD_a1:
        u.abon.a[2] = u.abon.a[2] + cVar1;
        break;
      default:
        if (sVar2 == 0x4c) {
          u.abon.a[5] = u.abon.a[5] + (-(urole.malenum != 0x168) | 1U);
        }
        else if (sVar2 == 0x51) {
          u.abon.a[1] = u.abon.a[1] + cVar1;
          goto switchD_0014f489_caseD_a1;
        }
      }
      uVar5 = (uint)otmp->oprops;
      if ((uVar5 >> 8 & 1) != 0) {
        u.abon.a[3] = u.abon.a[3] + cVar1;
        uVar5 = (uint)otmp->oprops;
      }
      uVar3 = u.abon.a._0_4_;
      if ((uVar5 >> 9 & 1) != 0) {
        u.abon.a[1] = u.abon.a[1] + cVar1;
        u.abon.a[2] = SUB41(uVar3,2);
        u.abon.a[3] = SUB41(uVar3,3);
        u.abon.a[2] = u.abon.a[2] + cVar1;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void calc_attr_bonus(void)
{
	int i, spe;
	struct obj *abon_items[] = { /* item slots that might affect abon */
		uarm /* body armor */,
		uarmu /* shirt */,
		uarmc /* cloak */,
		uarmh /* helmet */,
		uarms /* shield */,
		uarmg /* gloves */,
		uarmf /* boots */,
		uamul /* amulet */,
		uright/* right ring */,
		uleft /* left ring */,
	};
	
	memset(u.abon.a, 0, sizeof(u.abon.a));
	
	for (i = 0; i < SIZE(abon_items); i++) {
		if (!abon_items[i] || !equip_is_worn(abon_items[i]))
		    continue;
		
		spe = abon_items[i]->spe;
		switch (abon_items[i]->otyp) {
			case RIN_GAIN_STRENGTH:
			    ABON(A_STR) += spe;
			    break;
			    
			case RIN_GAIN_CONSTITUTION:
			    ABON(A_CON) += spe;
			    break;
			    
			case RIN_GAIN_INTELLIGENCE:
			    ABON(A_INT) += spe;
			    break;
			    
			case RIN_GAIN_WISDOM:
			    ABON(A_WIS) += spe;
			    break;
			    
			case RIN_GAIN_DEXTERITY:
			    ABON(A_DEX) += spe;
			    break;
			    
			case RIN_ADORNMENT:
			    ABON(A_CHA) += spe;
			    break;
			    
			case GAUNTLETS_OF_DEXTERITY:
			    ABON(A_DEX) += spe;
			    break;
			    
			case HELM_OF_BRILLIANCE:
			    ABON(A_INT) += spe;
			    ABON(A_WIS) += spe;
			    break;

			case CORNUTHAUM:
			    ABON(A_CHA) += (Role_if(PM_WIZARD) ? 1 : -1);
			    break;
		}

		if (abon_items[i]->oprops & ITEM_DEXTERITY) {
		    ABON(A_DEX) += spe;
		}

		if (abon_items[i]->oprops & ITEM_BRILLIANCE) {
		    ABON(A_INT) += spe;
		    ABON(A_WIS) += spe;
		}
	}
}